

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::createBuffers(SingleBindingCase *this)

{
  long lVar1;
  ulong uVar2;
  pointer puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  undefined8 *puVar13;
  int v;
  long lVar14;
  float fVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataBuf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  undefined1 local_a8 [4];
  float afStack_a4 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  float local_88;
  float local_84;
  undefined8 local_80;
  float local_78;
  float local_74;
  undefined8 local_70;
  float local_68;
  float local_64;
  undefined8 local_60;
  float local_58;
  float local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar8;
  
  iVar7 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c0,(long)((this->m_spec).bufferStride * 0x960 + (this->m_spec).bufferOffset),
             (allocator_type *)local_a8);
  local_38 = 0x3f80000000000000;
  uStack_30 = 0x3f80000000000000;
  local_48 = 0x3f8000003f000000;
  uStack_40 = 0x3f80000000000000;
  iVar7 = 0;
  lVar10 = 0;
  do {
    fVar15 = (float)(int)lVar10 / 20.0;
    afStack_a4[0] = fVar15 + fVar15 + -1.0;
    lVar1 = lVar10 + 1;
    fVar15 = (float)(int)lVar1 / 20.0;
    local_98._M_allocated_capacity._4_4_ = fVar15 + fVar15 + -1.0;
    lVar12 = 0;
    iVar11 = iVar7;
    do {
      uVar2 = lVar12 + lVar10;
      fVar15 = (float)(int)lVar12 / 20.0;
      local_a8 = (undefined1  [4])(fVar15 + fVar15 + -1.0);
      afStack_a4[1] = 0.0;
      afStack_a4[2] = 1.0;
      local_98._M_allocated_capacity._0_4_ = local_a8;
      local_98._8_8_ = 0x3f80000000000000;
      lVar12 = lVar12 + 1;
      fVar15 = (float)(int)lVar12 / 20.0;
      local_88 = fVar15 + fVar15 + -1.0;
      local_84 = (float)local_98._M_allocated_capacity._4_4_;
      local_80 = 0x3f80000000000000;
      local_78 = (float)local_a8;
      local_74 = afStack_a4[0];
      local_70 = 0x3f80000000000000;
      local_68 = local_88;
      local_64 = (float)local_98._M_allocated_capacity._4_4_;
      local_60 = 0x3f80000000000000;
      local_58 = local_88;
      local_54 = afStack_a4[0];
      local_50 = 0x3f80000000000000;
      lVar14 = 0;
      iVar9 = iVar11;
      do {
        uVar4 = *(undefined4 *)(local_a8 + lVar14 + 4);
        uVar5 = *(undefined4 *)((long)afStack_a4 + lVar14 + 4);
        uVar6 = *(undefined4 *)((long)afStack_a4 + lVar14 + 8);
        puVar3 = local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 ((this->m_spec).bufferStride * iVar9 +
                 (this->m_spec).positionAttrOffset + (this->m_spec).bufferOffset);
        *(undefined4 *)puVar3 = *(undefined4 *)(local_a8 + lVar14);
        *(undefined4 *)(puVar3 + 4) = uVar4;
        *(undefined4 *)(puVar3 + 8) = uVar5;
        *(undefined4 *)(puVar3 + 0xc) = uVar6;
        iVar9 = iVar9 + 1;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x60);
      puVar13 = &local_48;
      if ((uVar2 & 1) == 0) {
        puVar13 = &local_38;
      }
      if ((this->m_spec).hasColorAttr == true) {
        iVar9 = 0;
        do {
          uVar4 = *(undefined4 *)((long)puVar13 + 4);
          uVar5 = *(undefined4 *)(puVar13 + 1);
          uVar6 = *(undefined4 *)((long)puVar13 + 0xc);
          puVar3 = local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   ((iVar11 + iVar9) * (this->m_spec).bufferStride +
                   (this->m_spec).colorAttrOffset + (this->m_spec).bufferOffset);
          *(undefined4 *)puVar3 = *(undefined4 *)puVar13;
          *(undefined4 *)(puVar3 + 4) = uVar4;
          *(undefined4 *)(puVar3 + 8) = uVar5;
          *(undefined4 *)(puVar3 + 0xc) = uVar6;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 6);
      }
      iVar11 = iVar11 + 6;
    } while (lVar12 != 0x14);
    iVar7 = iVar7 + 0x78;
    lVar10 = lVar1;
  } while (lVar1 != 0x14);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_buf);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_buf);
  (**(code **)(lVar8 + 0x150))
            (0x8892,(long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  (**(code **)(lVar8 + 0x40))(0x8892,0);
  iVar7 = (**(code **)(lVar8 + 0x800))();
  if (iVar7 == 0) {
    if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  _local_a8 = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"could not init buffer","");
  tcu::TestError::TestError(this_00,(string *)local_a8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SingleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<deUint8>	dataBuf	(m_spec.bufferOffset + m_spec.bufferStride * GRID_SIZE * GRID_SIZE * 6);

	// In interleaved mode color rg and position zw are the same. Select "good" values for r and g
	const tcu::Vec4			colorA	(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			colorB	(0.5f, 1.0f, 0.0f, 1.0f);

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		const tcu::Vec4&	color = ((x + y) % 2 == 0) ? (colorA) : (colorB);
		const tcu::Vec4		positions[6] =
		{
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
		};

		// copy cell vertices to the buffer.
		for (int v = 0; v < 6; ++v)
			memcpy(&dataBuf[m_spec.bufferOffset + m_spec.positionAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], positions[v].getPtr(), sizeof(positions[v]));

		// copy color to buffer
		if (m_spec.hasColorAttr)
			for (int v = 0; v < 6; ++v)
				memcpy(&dataBuf[m_spec.bufferOffset + m_spec.colorAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], color.getPtr(), sizeof(color));
	}

	gl.genBuffers(1, &m_buf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buf);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)dataBuf.size(), &dataBuf[0], GL_STATIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	if (gl.getError() != GL_NO_ERROR)
		throw tcu::TestError("could not init buffer");
}